

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_ports_linux.cc
# Opt level: O2

string * read_line(string *__return_storage_ptr__,string *file)

{
  ifstream ifs;
  byte abStack_1f8 [488];
  
  std::ifstream::ifstream(&ifs,(file->_M_dataplus)._M_p,_S_in);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((abStack_1f8[*(long *)(_ifs + -0x18)] & 5) == 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&ifs,(string *)__return_storage_ptr__);
  }
  std::ifstream::~ifstream(&ifs);
  return __return_storage_ptr__;
}

Assistant:

string
read_line(const string& file)
{
    ifstream ifs(file.c_str(), ifstream::in);

    string line;

    if(ifs)
    {
        getline(ifs, line);
    }

    return line;
}